

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ProcessBuildsystemFile(cmMakefile *this,char *filename)

{
  bool bVar1;
  char *pcVar2;
  char *__rhs;
  allocator local_e9;
  string local_e8;
  undefined4 local_c4;
  undefined1 local_c0 [8];
  cmListFile listFile;
  value_type local_a0;
  allocator local_79;
  undefined1 local_78 [8];
  string curSrc;
  allocator local_41;
  string local_40;
  char *local_20;
  char *filename_local;
  cmMakefile *this_local;
  
  local_20 = filename;
  filename_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CMAKE_PARENT_LIST_FILE",&local_41);
  AddDefinition(this,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pcVar2 = GetCurrentSourceDirectory(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,pcVar2,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pcVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,pcVar2,
             (allocator *)
             ((long)&listFile.Functions.
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFileStack,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&listFile.Functions.
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmListFile::cmListFile((cmListFile *)local_c0);
  pcVar2 = local_20;
  __rhs = GetHomeDirectory(this);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78,__rhs);
  this_local._7_1_ = cmListFile::ParseFile((cmListFile *)local_c0,pcVar2,bVar1,this);
  if ((bool)this_local._7_1_) {
    PushPolicyBarrier(this);
    pcVar2 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,pcVar2,&local_e9);
    ReadListFile(this,(cmListFile *)local_c0,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    PopPolicyBarrier(this,(bool)(~bVar1 & 1));
    EnforceDirectoryLevelRules(this);
  }
  local_c4 = 1;
  cmListFile::~cmListFile((cmListFile *)local_c0);
  std::__cxx11::string::~string((string *)local_78);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::ProcessBuildsystemFile(const char* filename)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", filename);
  std::string curSrc = this->GetCurrentSourceDirectory();

  this->ListFileStack.push_back(filename);

  cmListFile listFile;
  if (!listFile.ParseFile(filename, curSrc == this->GetHomeDirectory(), this))
    {
    return false;
    }

  this->PushPolicyBarrier();
  this->ReadListFile(listFile, filename);
  this->PopPolicyBarrier(!cmSystemTools::GetFatalErrorOccured());
  this->EnforceDirectoryLevelRules();
  return true;
}